

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

any * Omega_h::anon_unknown_41::div<2>(any *__return_storage_ptr__,any *lhs,any *rhs)

{
  bool bVar1;
  type_info *ptVar2;
  ParserFail *pPVar3;
  any *operand;
  double dVar4;
  allocator local_221;
  string local_220 [38];
  undefined1 local_1fa;
  allocator local_1f9;
  string local_1f8 [32];
  Matrix<2,_2> local_1d8;
  undefined1 local_1b8 [8];
  Matrix<2,_2> c_1;
  double local_190;
  Vector<2> local_188;
  double local_178 [3];
  Reals local_160;
  Reals local_150;
  Read<double> local_140;
  any *local_130;
  any *rhs_local;
  any *lhs_local;
  int local_114;
  double dStack_110;
  Int i;
  double local_108 [3];
  Vector<2> c;
  double local_c8 [4];
  double local_a8;
  double local_a0;
  int local_84;
  double dStack_80;
  Int j;
  int local_74;
  undefined1 *local_70;
  int local_64;
  double *local_60;
  int local_54;
  double dStack_50;
  Int i_1;
  double local_48 [3];
  Vector<2> c_2;
  
  local_130 = rhs;
  rhs_local = lhs;
  lhs_local = __return_storage_ptr__;
  ptVar2 = any::type(rhs);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
  if (bVar1) {
    any_cast<Omega_h::Read<double>>((Omega_h *)&local_150,rhs_local);
    any_cast<Omega_h::Read<double>>((Omega_h *)&local_160,local_130);
    divide_each_maybe_zero((Omega_h *)&local_140,&local_150,&local_160);
    any::any<Omega_h::Read<double>,void>(__return_storage_ptr__,&local_140);
    Read<double>::~Read(&local_140);
    Read<double>::~Read(&local_160);
    Read<double>::~Read(&local_150);
  }
  else {
    ptVar2 = any::type(local_130);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&double::typeinfo);
    if (!bVar1) {
      pPVar3 = (ParserFail *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,"Invalid right operand type in / operator",&local_221);
      ParserFail::ParserFail(pPVar3,(string *)local_220);
      __cxa_throw(pPVar3,&ParserFail::typeinfo,ParserFail::~ParserFail);
    }
    ptVar2 = any::type(rhs_local);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&double::typeinfo);
    if (bVar1) {
      dVar4 = any_cast<double>(rhs_local);
      local_178[0] = any_cast<double>(local_130);
      local_178[0] = dVar4 / local_178[0];
      any::any<double,void>(__return_storage_ptr__,local_178);
    }
    else {
      ptVar2 = any::type(rhs_local);
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Vector<2>::typeinfo);
      if (bVar1) {
        join_0x00001240_0x00001200_ = (double  [2])any_cast<Omega_h::Vector<2>>(rhs_local);
        dStack_110 = any_cast<double>(local_130);
        local_108[0] = c_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1]
        ;
        local_108[1] = local_190;
        for (local_114 = 0; local_114 < 2; local_114 = local_114 + 1) {
          c.super_Few<double,_2>.array_[1]._4_4_ = local_114;
          c.super_Few<double,_2>.array_[(long)local_114 + -1] = local_108[local_114] / dStack_110;
        }
        local_188.super_Few<double,_2>.array_[0] = local_108[2];
        local_188.super_Few<double,_2>.array_[1] = c.super_Few<double,_2>.array_[0];
        any::any<Omega_h::Vector<2>,void>(__return_storage_ptr__,&local_188);
      }
      else {
        ptVar2 = any::type(rhs_local);
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Matrix<2,2>::typeinfo);
        if (!bVar1) {
          local_1fa = 1;
          pPVar3 = (ParserFail *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1f8,"Invalid left operand type in / operator",&local_1f9);
          ParserFail::ParserFail(pPVar3,(string *)local_1f8);
          local_1fa = 0;
          __cxa_throw(pPVar3,&ParserFail::typeinfo,ParserFail::~ParserFail);
        }
        any_cast<Omega_h::Matrix<2,2>>(&local_1d8,(Omega_h *)rhs_local,operand);
        dStack_80 = any_cast<double>(local_130);
        local_c8[0] = local_1d8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
                      array_[0];
        local_c8[1] = local_1d8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
                      array_[1];
        local_c8[2] = local_1d8.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.
                      array_[0];
        local_c8[3] = local_1d8.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.
                      array_[1];
        for (local_84 = 0; local_84 < 2; local_84 = local_84 + 1) {
          local_64 = local_84;
          local_60 = local_c8;
          local_a8 = local_60[(long)local_84 * 2];
          local_a0 = local_c8[(long)local_84 * 2 + 1];
          for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
            c_2.super_Few<double,_2>.array_[1]._4_4_ = local_54;
            c_2.super_Few<double,_2>.array_[(long)local_54 + -1] = local_48[local_54] / dStack_80;
          }
          local_74 = local_84;
          local_70 = local_1b8;
          *(double *)(local_70 + (long)local_84 * 0x10) = local_48[2];
          c_1.super_Few<Omega_h::Vector<2>,_2>.array_[local_84].super_Few<double,_2>.array_[0] =
               c_2.super_Few<double,_2>.array_[0];
          dStack_50 = dStack_80;
          local_48[0] = local_a8;
          local_48[1] = local_a0;
        }
        any::any<Omega_h::Matrix<2,2>,void>(__return_storage_ptr__,(Matrix<2,_2> *)local_1b8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

any div(any& lhs, any& rhs) {
  if (rhs.type() == typeid(Reals)) {
    return Reals(
        divide_each_maybe_zero(any_cast<Reals>(lhs), any_cast<Reals>(rhs)));
  } else if (rhs.type() == typeid(Real)) {
    if (lhs.type() == typeid(Real)) {
      return any_cast<Real>(lhs) / any_cast<Real>(rhs);
    } else if (lhs.type() == typeid(Vector<dim>)) {
      return any_cast<Vector<dim>>(lhs) / any_cast<Real>(rhs);
    } else if (lhs.type() == typeid(Tensor<dim>)) {
      return any_cast<Tensor<dim>>(lhs) / any_cast<Real>(rhs);
    } else {
      throw ParserFail("Invalid left operand type in / operator");
    }
  } else {
    throw ParserFail("Invalid right operand type in / operator");
  }
}